

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O2

void ReadFilesIntoMemory(void)

{
  XMLCh *pXVar1;
  FILE *__stream;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char *__format;
  size_t *psVar5;
  
  if (gRunInfo.inMemory) {
    psVar5 = &gRunInfo.files[0].fileSize;
    for (lVar4 = 0; lVar4 < gRunInfo.numInputFiles; lVar4 = lVar4 + 1) {
      pXVar1 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                  (((InFileInfo *)(psVar5 + -3))->fileName,
                                   xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      psVar5[-2] = (size_t)pXVar1;
      __stream = fopen64(((InFileInfo *)(psVar5 + -3))->fileName,"rb");
      if (__stream == (FILE *)0x0) {
        pcVar3 = ((InFileInfo *)(psVar5 + -3))->fileName;
        __format = "Can not open file \"%s\".\n";
LAB_0010588e:
        fprintf(_stderr,__format,pcVar3);
        clearFileInfoMemory();
        exit(-1);
      }
      fseek(__stream,0,2);
      sVar2 = ftell(__stream);
      *psVar5 = sVar2;
      fseek(__stream,0,0);
      sVar2 = *psVar5;
      pcVar3 = (char *)operator_new__(sVar2 + 1);
      psVar5[-1] = (size_t)pcVar3;
      sVar2 = fread(pcVar3,1,sVar2,__stream);
      if (sVar2 != *psVar5) {
        pcVar3 = ((InFileInfo *)(psVar5 + -3))->fileName;
        __format = "Error reading file \"%s\".\n";
        goto LAB_0010588e;
      }
      fclose(__stream);
      ((char *)psVar5[-1])[*psVar5] = '\0';
      psVar5 = psVar5 + 5;
    }
  }
  return;
}

Assistant:

void ReadFilesIntoMemory()
{
    int     fileNum;
    FILE    *fileF;
    size_t  t;

    if (gRunInfo.inMemory)
    {
        for (fileNum = 0; fileNum <gRunInfo.numInputFiles; fileNum++)
        {
            InFileInfo *fInfo = &gRunInfo.files[fileNum];
            fInfo->uFileName = XMLString::transcode(fInfo->fileName);
            fileF = fopen( fInfo->fileName, "rb" );
            if (fileF == 0) {
                fprintf(stderr, "Can not open file \"%s\".\n", fInfo->fileName);
                clearFileInfoMemory();
                exit(-1);
            }
            fseek(fileF, 0, SEEK_END);
            fInfo->fileSize = ftell(fileF);
            fseek(fileF, 0, SEEK_SET);
            fInfo->fileContent = new char[fInfo->fileSize + 1];
            t = fread(fInfo->fileContent, 1, fInfo->fileSize, fileF);
            if (t != fInfo->fileSize) {
                fprintf(stderr, "Error reading file \"%s\".\n", fInfo->fileName);
                clearFileInfoMemory();
                exit(-1);
            }
            fclose(fileF);
            fInfo->fileContent[fInfo->fileSize] = 0;
        }
    }
}